

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O3

void __thiscall
ddd::DictionarySGL<true,_false>::DictionarySGL(DictionarySGL<true,_false> *this,istream *is)

{
  DaTrie<true,_false,_false> *this_00;
  
  (this->super_Dictionary)._vptr_Dictionary = (_func_int **)&PTR__DictionarySGL_00140860;
  (this->trie_)._M_t.
  super___uniq_ptr_impl<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_ddd::DaTrie<true,_false,_false>_*,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
  .super__Head_base<0UL,_ddd::DaTrie<true,_false,_false>_*,_false>._M_head_impl =
       (DaTrie<true,_false,_false> *)0x0;
  this->num_keys_ = 0;
  this_00 = (DaTrie<true,_false,_false> *)operator_new(0x70);
  DaTrie<true,_false,_false>::DaTrie(this_00,is);
  std::
  __uniq_ptr_impl<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
  ::reset((__uniq_ptr_impl<ddd::DaTrie<true,_false,_false>,_std::default_delete<ddd::DaTrie<true,_false,_false>_>_>
           *)&this->trie_,this_00);
  std::istream::read((char *)is,(long)&this->num_keys_);
  return;
}

Assistant:

DictionarySGL(std::istream& is) {
    trie_ = make_unique<TrieType>(is);
    utils::read_value(num_keys_, is);
  }